

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O3

TPZTransform<double> *
pzshape::TPZShapeTriang::ParametricTransform
          (TPZTransform<double> *__return_storage_ptr__,int trans_id)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,2,2);
  lVar3 = (long)trans_id * 0x20;
  lVar1 = (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fRow;
  if ((lVar1 < 1) ||
     ((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
      super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2 = (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.fElem;
  *pdVar2 = *(double *)(gTrans2dT + lVar3);
  if ((lVar1 < 1) ||
     ((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
      super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2[lVar1] = *(double *)(gTrans2dT + lVar3 + 8);
  if ((lVar1 < 2) ||
     ((__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
      super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2[1] = *(double *)(gTrans2dT + lVar3 + 0x10);
  if ((1 < lVar1) &&
     (1 < (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fCol)) {
    pdVar2[lVar1 + 1] = *(double *)(gTrans2dT + lVar3 + 0x18);
    lVar3 = (long)trans_id * 0x10;
    lVar1 = (__return_storage_ptr__->fSum).super_TPZFMatrix<double>.super_TPZMatrix<double>.
            super_TPZBaseMatrix.fRow;
    if ((lVar1 < 1) ||
       ((__return_storage_ptr__->fSum).super_TPZFMatrix<double>.super_TPZMatrix<double>.
        super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar2 = (__return_storage_ptr__->fSum).super_TPZFMatrix<double>.fElem;
    *pdVar2 = *(double *)(gVet2dT + lVar3);
    if ((1 < lVar1) &&
       (0 < (__return_storage_ptr__->fSum).super_TPZFMatrix<double>.super_TPZMatrix<double>.
            super_TPZBaseMatrix.fCol)) {
      pdVar2[1] = *(double *)(gVet2dT + lVar3 + 8);
      return __return_storage_ptr__;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

TPZTransform<REAL>  TPZShapeTriang::ParametricTransform(int trans_id){
        TPZTransform<REAL> trans(2,2);
        trans.Mult()(0,0) = gTrans2dT[trans_id][0][0];
        trans.Mult()(0,1) = gTrans2dT[trans_id][0][1];
        trans.Mult()(1,0) = gTrans2dT[trans_id][1][0];
        trans.Mult()(1,1) = gTrans2dT[trans_id][1][1];
        trans.Sum()(0,0) =gVet2dT[trans_id][0];
        trans.Sum()(1,0) =gVet2dT[trans_id][1];
        return trans;
        
    }